

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O2

BaseExc * __thiscall Iex_3_2::BaseExc::assign(BaseExc *this,stringstream *s)

{
  string asStack_38 [32];
  
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->_message,asStack_38);
  std::__cxx11::string::~string(asStack_38);
  return this;
}

Assistant:

BaseExc&
BaseExc::assign (std::stringstream& s)
{
    _message.assign (s.str ());
    return *this;
}